

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# layout.c++
# Opt level: O0

Builder * __thiscall
capnp::_::ListBuilder::asText(Builder *__return_storage_ptr__,ListBuilder *this)

{
  bool bVar1;
  uint uVar2;
  bool local_f9;
  Fault local_f8;
  Fault f_2;
  char *local_e8;
  undefined1 local_e0 [8];
  DebugComparison<char_&,_char> _kjCondition_2;
  char *cptr;
  Fault f_1;
  unsigned_long *local_a0;
  undefined1 local_98 [8];
  DebugComparison<unsigned_long_&,_int> _kjCondition_1;
  size_t size;
  Fault local_58;
  Fault f;
  uint *local_48;
  DebugComparison<unsigned_int_&,_unsigned_int> local_40;
  bool local_11;
  ListBuilder *pLStack_10;
  bool _kjCondition;
  ListBuilder *this_local;
  
  pLStack_10 = this;
  local_48 = (uint *)kj::_::DebugExpressionStart::operator<<
                               ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&this->structDataSize);
  f.exception._4_4_ = 8;
  kj::_::DebugExpression<unsigned_int&>::operator==
            (&local_40,(DebugExpression<unsigned_int&> *)&local_48,(uint *)((long)&f.exception + 4))
  ;
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)&local_40);
  local_f9 = false;
  if (bVar1) {
    local_f9 = this->structPointerCount == 0;
  }
  local_11 = local_f9;
  if (local_f9 == false) {
    kj::_::Debug::Fault::Fault<kj::Exception::Type,bool&,char_const(&)[38]>
              (&local_58,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
               ,0xbf6,FAILED,
               "structDataSize == G(8) * BITS && structPointerCount == ZERO * POINTERS",
               "_kjCondition,\"Expected Text, got list of non-bytes.\"",&local_11,
               (char (*) [38])0x227a17);
    Text::Builder::Builder(__return_storage_ptr__);
    kj::_::Debug::Fault::~Fault(&local_58);
  }
  else {
    uVar2 = unbound<unsigned_int>(this->elementCount);
    _kjCondition_1._32_8_ = ZEXT48(uVar2);
    local_a0 = (unsigned_long *)
               kj::_::DebugExpressionStart::operator<<
                         ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                          (unsigned_long *)&_kjCondition_1.result);
    f_1.exception._4_4_ = 0;
    kj::_::DebugExpression<unsigned_long&>::operator>
              ((DebugComparison<unsigned_long_&,_int> *)local_98,
               (DebugExpression<unsigned_long&> *)&local_a0,(int *)((long)&f_1.exception + 4));
    bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_98);
    if (bVar1) {
      _kjCondition_2._32_8_ = this->ptr;
      _kjCondition_1._32_8_ = _kjCondition_1._32_8_ + -1;
      local_e8 = (char *)kj::_::DebugExpressionStart::operator<<
                                   ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,
                                    (char *)(_kjCondition_2._32_8_ + _kjCondition_1._32_8_));
      f_2.exception._7_1_ = 0;
      kj::_::DebugExpression<char&>::operator==
                ((DebugComparison<char_&,_char> *)local_e0,(DebugExpression<char&> *)&local_e8,
                 (char *)((long)&f_2.exception + 7));
      bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_e0);
      if (bVar1) {
        Text::Builder::Builder
                  (__return_storage_ptr__,(char *)_kjCondition_2._32_8_,_kjCondition_1._32_8_);
      }
      else {
        kj::_::Debug::Fault::
        Fault<kj::Exception::Type,kj::_::DebugComparison<char&,char>&,char_const(&)[50]>
                  (&local_f8,
                   "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                   ,0xc03,FAILED,"cptr[size] == \'\\0\'",
                   "_kjCondition,\"Message contains text that is not NUL-terminated.\"",
                   (DebugComparison<char_&,_char> *)local_e0,
                   (char (*) [50])"Message contains text that is not NUL-terminated.");
        Text::Builder::Builder(__return_storage_ptr__);
        kj::_::Debug::Fault::~Fault(&local_f8);
      }
    }
    else {
      kj::_::Debug::Fault::
      Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,int>&,char_const(&)[50]>
                ((Fault *)&cptr,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/layout.c++"
                 ,0xbfc,FAILED,"size > 0",
                 "_kjCondition,\"Message contains text that is not NUL-terminated.\"",
                 (DebugComparison<unsigned_long_&,_int> *)local_98,
                 (char (*) [50])"Message contains text that is not NUL-terminated.");
      Text::Builder::Builder(__return_storage_ptr__);
      kj::_::Debug::Fault::~Fault((Fault *)&cptr);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

Text::Builder ListBuilder::asText() {
  KJ_REQUIRE(structDataSize == G(8) * BITS && structPointerCount == ZERO * POINTERS,
             "Expected Text, got list of non-bytes.") {
    return Text::Builder();
  }

  size_t size = unbound(elementCount / ELEMENTS);

  KJ_REQUIRE(size > 0, "Message contains text that is not NUL-terminated.") {
    return Text::Builder();
  }

  char* cptr = reinterpret_cast<char*>(ptr);
  --size;  // NUL terminator

  KJ_REQUIRE(cptr[size] == '\0', "Message contains text that is not NUL-terminated.") {
    return Text::Builder();
  }

  return Text::Builder(cptr, size);
}